

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O3

int FindDiffVars(int *pDiffVars,Cube *pC1,Cube *pC2)

{
  byte bVar1;
  byte bVar2;
  drow *pdVar3;
  drow *pdVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  DiffVarCounter = 0;
  if (0 < (long)g_CoverInfo.nWordsOut) {
    lVar10 = 0;
    do {
      if (pC1->pCubeDataOut[lVar10] != pC2->pCubeDataOut[lVar10]) {
        *pDiffVars = -1;
        DiffVarCounter = 1;
        uVar8 = 1;
        goto LAB_002f8284;
      }
      lVar10 = lVar10 + 1;
    } while (g_CoverInfo.nWordsOut != lVar10);
  }
  uVar8 = 0;
LAB_002f8284:
  if (g_CoverInfo.nWordsIn < 1) {
    iVar7 = (int)uVar8;
  }
  else {
    pdVar3 = pC1->pCubeDataIn;
    pdVar4 = pC2->pCubeDataIn;
    lVar10 = 0;
    do {
      uVar5 = pdVar4[lVar10] ^ pdVar3[lVar10];
      uVar5 = uVar5 >> 1 | uVar5;
      uVar6 = uVar5 & 0x5555;
      bVar1 = BitCount[uVar6];
      if ((ulong)bVar1 != 0) {
        if (4 < bVar1) {
          return 5;
        }
        bVar2 = BitGroupNumbers[uVar6];
        if (bVar2 == 200) {
          __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                        ,0x157,"int FindDiffVars(int *, Cube *, Cube *)");
        }
        iVar7 = (int)uVar8;
        uVar9 = 0;
        do {
          pDiffVars[(long)iVar7 + uVar9] = (uint)GroupLiterals[bVar2][uVar9] + (int)lVar10 * 0x10;
          uVar9 = uVar9 + 1;
        } while (bVar1 != uVar9);
        uVar8 = (uVar8 & 0xffffffff) + uVar9;
        DiffVarCounter = (int)uVar8;
        if (3 < (long)((long)iVar7 + uVar9 + -1)) {
          return 5;
        }
      }
      uVar5 = uVar5 >> 0x10 & 0x5555;
      bVar1 = BitCount[uVar5];
      if ((ulong)bVar1 != 0) {
        if (4 < bVar1) {
          return 5;
        }
        bVar2 = BitGroupNumbers[uVar5];
        if (bVar2 == 200) {
          __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                        ,0x168,"int FindDiffVars(int *, Cube *, Cube *)");
        }
        iVar7 = (int)uVar8;
        uVar9 = 0;
        do {
          pDiffVars[(long)iVar7 + uVar9] =
               (uint)GroupLiterals[bVar2][uVar9] + ((int)lVar10 << 4 | 8U);
          uVar9 = uVar9 + 1;
        } while (bVar1 != uVar9);
        uVar8 = (uVar8 & 0xffffffff) + uVar9;
        DiffVarCounter = (int)uVar8;
        if (3 < (long)((long)iVar7 + uVar9 + -1)) {
          return 5;
        }
      }
      lVar10 = lVar10 + 1;
      iVar7 = (int)uVar8;
    } while (lVar10 < g_CoverInfo.nWordsIn);
  }
  return iVar7;
}

Assistant:

int FindDiffVars( int * pDiffVars, Cube * pC1, Cube * pC2 )
// determine different variables in two cubes and 
// writes them into pDiffVars[]
// -1 is written into pDiffVars[0] if the cubes have different outputs
// returns the number of different variables (including the output)
{
    int i, v;
    DiffVarCounter = 0;
    // check whether the output parts of the cubes are different

    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
        if ( pC1->pCubeDataOut[i] != pC2->pCubeDataOut[i] )
        { // they are different
            pDiffVars[0] = -1;
            DiffVarCounter = 1;
            break;
        }

    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
    {

        Temp1 = pC1->pCubeDataIn[i] ^ pC2->pCubeDataIn[i];
        Temp2 = (Temp1|(Temp1>>1)) & DIFFERENT;

        // check the first part of this word
        Temp = Temp2 & 0xffff;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;

        // check the second part of this word
        Temp = Temp2 >> 16;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + 8 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;
    }
    return DiffVarCounter;
}